

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O1

int64_t __thiscall
TPZStructMatrixOR<std::complex<double>_>::ThreadData::NextElement(ThreadData *this)

{
  TPZCompMesh *pTVar1;
  long lVar2;
  TPZCompEl *pTVar3;
  char cVar4;
  int iVar5;
  TPZCompEl **ppTVar6;
  long nelem;
  long lVar7;
  int local_2c;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->fMutexAccessElement);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  nelem = this->fNextElement;
  pTVar1 = this->fStruct->fMesh;
  lVar2 = (pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  lVar7 = nelem;
  if (nelem < lVar2) {
    do {
      ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
      pTVar3 = *ppTVar6;
      if ((pTVar3 != (TPZCompEl *)0x0) &&
         (((this->fStruct->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 ||
          (cVar4 = (**(code **)(*(long *)pTVar3 + 0x88))(pTVar3,&this->fStruct->fMaterialIds),
          cVar4 != '\0')))) {
        this->fNextElement = nelem + 1;
        local_2c = (int)nelem;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>(&(this->fProcessed)._M_t,&local_2c);
        goto LAB_0136035a;
      }
      nelem = nelem + 1;
      lVar7 = lVar2;
    } while (lVar2 != nelem);
  }
  this->fNextElement = lVar7 + 1;
  nelem = lVar7;
LAB_0136035a:
  pthread_mutex_unlock((pthread_mutex_t *)&this->fMutexAccessElement);
  return nelem;
}

Assistant:

int64_t 
TPZStructMatrixOR<TVar>::ThreadData::NextElement() {
    fMutexAccessElement.lock();
    int64_t iel;
    int64_t nextel = fNextElement;
    TPZCompMesh *cmesh = fStruct->Mesh();
    TPZAdmChunkVector<TPZCompEl *> &elementvec = cmesh->ElementVec();
    int64_t nel = elementvec.NElements();
    for (iel = fNextElement; iel < nel; iel++) {
        TPZCompEl *el = elementvec[iel];
        if (!el) continue;
        if (fStruct->MaterialIds().size() == 0) break;
        if (el->NeedsComputing(fStruct->MaterialIds())) break;
    }
    fNextElement = iel + 1;
    nextel = iel;
    if (iel < nel) fProcessed.insert(iel); //AQUIBORIN pelo que percebi, aqui tem que acontecer antes do unlock no caso sem Critical Section
    fMutexAccessElement.unlock();
#ifdef PZ_LOG
    {
        if (logger.isDebugEnabled()) {
            std::stringstream sout;
            sout << __PRETTY_FUNCTION__ << " returning " << nextel << " fNextElement " << fNextElement;
            LOGPZ_DEBUG(logger, sout.str())
        }
    }
#endif
    return nextel;
}